

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_open(zip_t *zip,char *entryname)

{
  int iVar1;
  mz_bool mVar2;
  mz_uint flags;
  tdefl_status tVar3;
  size_t n;
  char *pcVar4;
  size_t sVar5;
  time_t tVar6;
  undefined1 local_280 [8];
  mz_zip_archive_file_stat stats;
  mz_uint level;
  mz_uint num_alignment_padding_bytes;
  mz_zip_archive *pzip;
  size_t entrylen;
  char *entryname_local;
  zip_t *zip_local;
  
  if ((zip == (zip_t *)0x0) || (entryname == (char *)0x0)) {
    return -1;
  }
  n = strlen(entryname);
  if (n == 0) {
    return -1;
  }
  pcVar4 = strrpl(entryname,n,'\\','/');
  (zip->entry).name = pcVar4;
  if ((zip->entry).name == (char *)0x0) {
    return -1;
  }
  if ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) {
    iVar1 = mz_zip_reader_locate_file(&zip->archive,(zip->entry).name,(char *)0x0,0);
    (zip->entry).index = iVar1;
    if ((-1 < (zip->entry).index) &&
       (mVar2 = mz_zip_reader_file_stat
                          (&zip->archive,(zip->entry).index,(mz_zip_archive_file_stat *)local_280),
       mVar2 != 0)) {
      (zip->entry).comp_size = stats._24_8_;
      (zip->entry).uncomp_size = stats.m_comp_size;
      (zip->entry).uncomp_crc32 = (mz_uint32)stats.m_time;
      (zip->entry).offset = (ulong)(uint)local_280._4_4_;
      (zip->entry).header_offset = stats._48_8_;
      (zip->entry).method = stats.m_central_dir_ofs._2_2_;
      (zip->entry).external_attr = stats.m_uncomp_size._4_4_;
      (zip->entry).m_time = stats._8_8_;
      return 0;
    }
  }
  else {
    (zip->entry).index = (zip->archive).m_total_files;
    (zip->entry).comp_size = 0;
    (zip->entry).uncomp_size = 0;
    (zip->entry).uncomp_crc32 = 0;
    (zip->entry).offset = (zip->archive).m_archive_size;
    (zip->entry).header_offset = (zip->archive).m_archive_size;
    memset((zip->entry).header,0,0x1e);
    (zip->entry).method = 0;
    (zip->entry).external_attr = 0;
    stats.m_comment._252_4_ = mz_zip_writer_compute_padding_needed_for_file_alignment(&zip->archive)
    ;
    if ((((((zip->archive).m_pState != (mz_zip_internal_state *)0x0) &&
          ((zip->archive).m_zip_mode == MZ_ZIP_MODE_WRITING)) && ((zip->level & 0x400) == 0)) &&
        (((zip->archive).m_total_files != 0xffff &&
         ((zip->archive).m_archive_size + (ulong)(uint)stats.m_comment._252_4_ + 0x4c + n <
          0x100000000)))) &&
       (mVar2 = mz_zip_writer_write_zeros
                          (&zip->archive,(zip->entry).offset,stats.m_comment._252_4_ + 0x1e),
       mVar2 != 0)) {
      (zip->entry).header_offset = (ulong)(uint)stats.m_comment._252_4_ + (zip->entry).header_offset
      ;
      if (((zip->archive).m_file_offset_alignment != 0) &&
         (((zip->entry).header_offset & (ulong)((zip->archive).m_file_offset_alignment - 1)) != 0))
      {
        __assert_fail("(zip->entry.header_offset & (pzip->m_file_offset_alignment - 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/zip/src/zip.c"
                      ,0x139,"int zip_entry_open(struct zip_t *, const char *)");
      }
      (zip->entry).offset = (ulong)(uint)stats.m_comment._252_4_ + 0x1e + (zip->entry).offset;
      sVar5 = (*(zip->archive).m_pWrite)
                        ((zip->archive).m_pIO_opaque,(zip->entry).offset,(zip->entry).name,n);
      if (sVar5 == n) {
        (zip->entry).offset = n + (zip->entry).offset;
        stats.m_comment._248_4_ = zip->level & 0xf;
        if (stats.m_comment._248_4_ != 0) {
          (zip->entry).state.m_pZip = &zip->archive;
          (zip->entry).state.m_cur_archive_file_ofs = (zip->entry).offset;
          (zip->entry).state.m_comp_size = 0;
          flags = tdefl_create_comp_flags_from_zip_params(stats.m_comment._248_4_,-0xf,0);
          tVar3 = tdefl_init(&(zip->entry).comp,mz_zip_writer_add_put_buf_callback,
                             &(zip->entry).state,flags);
          if (tVar3 != TDEFL_STATUS_OKAY) goto LAB_00bd3156;
        }
        tVar6 = time((time_t *)0x0);
        (zip->entry).m_time = tVar6;
        return 0;
      }
    }
  }
LAB_00bd3156:
  if ((zip->entry).name != (char *)0x0) {
    free((zip->entry).name);
    (zip->entry).name = (char *)0x0;
  }
  return -1;
}

Assistant:

int zip_entry_open(struct zip_t *zip, const char *entryname) {
  size_t entrylen = 0;
  mz_zip_archive *pzip = NULL;
  mz_uint num_alignment_padding_bytes, level;
  mz_zip_archive_file_stat stats;

  if (!zip || !entryname) {
    return -1;
  }

  entrylen = strlen(entryname);
  if (entrylen < 1) {
    return -1;
  }

  /*
    .ZIP File Format Specification Version: 6.3.3

    4.4.17.1 The name of the file, with optional relative path.
    The path stored MUST not contain a drive or
    device letter, or a leading slash.  All slashes
    MUST be forward slashes '/' as opposed to
    backwards slashes '\' for compatibility with Amiga
    and UNIX file systems etc.  If input came from standard
    input, there is no file name field.
  */
  zip->entry.name = strrpl(entryname, entrylen, '\\', '/');
  if (!zip->entry.name) {
    // Cannot parse zip entry name
    return -1;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode == MZ_ZIP_MODE_READING) {
    zip->entry.index =
        mz_zip_reader_locate_file(pzip, zip->entry.name, NULL, 0);
    if (zip->entry.index < 0) {
      goto cleanup;
    }

    if (!mz_zip_reader_file_stat(pzip, (mz_uint)zip->entry.index, &stats)) {
      goto cleanup;
    }

    zip->entry.comp_size = stats.m_comp_size;
    zip->entry.uncomp_size = stats.m_uncomp_size;
    zip->entry.uncomp_crc32 = stats.m_crc32;
    zip->entry.offset = stats.m_central_dir_ofs;
    zip->entry.header_offset = stats.m_local_header_ofs;
    zip->entry.method = stats.m_method;
    zip->entry.external_attr = stats.m_external_attr;
    zip->entry.m_time = stats.m_time;

    return 0;
  }

  zip->entry.index = (int)zip->archive.m_total_files;
  zip->entry.comp_size = 0;
  zip->entry.uncomp_size = 0;
  zip->entry.uncomp_crc32 = MZ_CRC32_INIT;
  zip->entry.offset = zip->archive.m_archive_size;
  zip->entry.header_offset = zip->archive.m_archive_size;
  memset(zip->entry.header, 0, MZ_ZIP_LOCAL_DIR_HEADER_SIZE * sizeof(mz_uint8));
  zip->entry.method = 0;
  zip->entry.external_attr = 0;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pzip);

  if (!pzip->m_pState || (pzip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    // Wrong zip mode
    goto cleanup;
  }
  if (zip->level & MZ_ZIP_FLAG_COMPRESSED_DATA) {
    // Wrong zip compression level
    goto cleanup;
  }
  // no zip64 support yet
  if ((pzip->m_total_files == 0xFFFF) ||
      ((pzip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        entrylen) > 0xFFFFFFFF)) {
    // No zip64 support yet
    goto cleanup;
  }
  if (!mz_zip_writer_write_zeros(pzip, zip->entry.offset,
                                 num_alignment_padding_bytes +
                                     sizeof(zip->entry.header))) {
    // Cannot memset zip entry header
    goto cleanup;
  }

  zip->entry.header_offset += num_alignment_padding_bytes;
  if (pzip->m_file_offset_alignment) {
    MZ_ASSERT(
        (zip->entry.header_offset & (pzip->m_file_offset_alignment - 1)) == 0);
  }
  zip->entry.offset += num_alignment_padding_bytes + sizeof(zip->entry.header);

  if (pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.offset, zip->entry.name,
                     entrylen) != entrylen) {
    // Cannot write data to zip entry
    goto cleanup;
  }

  zip->entry.offset += entrylen;
  level = zip->level & 0xF;
  if (level) {
    zip->entry.state.m_pZip = pzip;
    zip->entry.state.m_cur_archive_file_ofs = zip->entry.offset;
    zip->entry.state.m_comp_size = 0;

    if (tdefl_init(&(zip->entry.comp), mz_zip_writer_add_put_buf_callback,
                   &(zip->entry.state),
                   (int)tdefl_create_comp_flags_from_zip_params(
                       (int)level, -15, MZ_DEFAULT_STRATEGY)) !=
        TDEFL_STATUS_OKAY) {
      // Cannot initialize the zip compressor
      goto cleanup;
    }
  }

  zip->entry.m_time = time(NULL);

  return 0;

cleanup:
  CLEANUP(zip->entry.name);
  return -1;
}